

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer1.cpp
# Opt level: O1

void consume(void)

{
  int iVar1;
  optional<int> oVar2;
  pthread_t pVar3;
  ostream *this;
  long *plVar4;
  int *piVar5;
  timespec local_40;
  
  rtb::Concurrency::Queue<int>::subscribe(&q);
  do {
    oVar2 = rtb::Concurrency::Queue<int>::pop(&q);
    if (((ulong)oVar2.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> >> 0x20 & 1) == 0) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Consumer (id#",0xd);
    pVar3 = pthread_self();
    if (pVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"thread::id of a non-executing thread",0x24);
      this = (ostream *)&std::cout;
    }
    else {
      this = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this,"): ",3);
    plVar4 = (long *)std::ostream::operator<<
                               ((ostream *)this,
                                oVar2.super__Optional_base<int,_true,_true>._M_payload.
                                super__Optional_payload_base<int>._M_payload);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    local_40.tv_sec = 0;
    local_40.tv_nsec = 20000000;
    do {
      iVar1 = nanosleep(&local_40,&local_40);
      if (iVar1 != -1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
  } while (((ulong)oVar2.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int> >> 0x20 & 1) != 0);
  rtb::Concurrency::Queue<int>::unsubscribe(&q);
  return;
}

Assistant:

void consume() {
    // Important, you always need to subscribe to the `Queue` prior reading from it
    q.subscribe();
    while (auto val{ q.pop() }) {
        cout << "Consumer (id#" << std::this_thread::get_id() << "): " << val.value() << endl;
        std::this_thread::sleep_for(std::chrono::milliseconds(20));
    }
    // When no consumers are subscribet to the `Queue`, data is removed from the Queue and
    // no new data is added until a new consumer subscribes
    q.unsubscribe();
}